

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_f1a6f8::HandleRandomCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  double dVar2;
  cmExecutionStatus *pcVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  cmMakefile *this;
  undefined1 auVar11 [16];
  uint local_1ac;
  string_view local_178;
  value_type local_161;
  int local_160;
  int local_15c;
  int idx;
  int cc;
  char *alphaPtr;
  vector<char,_std::allocator<char>_> result;
  string *variableName;
  string local_128;
  undefined4 local_108;
  allocator<char> local_101;
  string local_100;
  double local_e0;
  double sizeofAlphabet;
  size_t stopAt;
  size_t i;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  int local_60;
  uint local_5c;
  int length;
  uint seed;
  bool force_seed;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (((sVar6 < 2) ||
      (sVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local), sVar6 == 3)) ||
     (sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local), sVar6 == 5)) {
    pcVar3 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command RANDOM requires at least one argument.",&local_41);
    cmExecutionStatus::SetError(pcVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    bVar1 = false;
    local_5c = 0;
    local_60 = 5;
    memcpy((void *)((long)&alphabet.field_2 + 8),
           "qwertyuiopasdfghjklzxcvbnmQWERTYUIOPASDFGHJKLZXCVBNM0123456789",0x3f);
    std::__cxx11::string::string((string *)&i);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (3 < sVar6) {
      stopAt = 1;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      sizeofAlphabet = (double)(sVar6 - 2);
      for (; stopAt < (ulong)sizeofAlphabet; stopAt = stopAt + 1) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,stopAt);
        bVar4 = std::operator==(pvVar7,"LENGTH");
        if (bVar4) {
          stopAt = stopAt + 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local,stopAt);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          local_60 = atoi(pcVar8);
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,stopAt);
          bVar4 = std::operator==(pvVar7,"ALPHABET");
          if (bVar4) {
            stopAt = stopAt + 1;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,stopAt);
            std::__cxx11::string::operator=((string *)&i,(string *)pvVar7);
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,stopAt);
            bVar4 = std::operator==(pvVar7,"RANDOM_SEED");
            if (bVar4) {
              stopAt = stopAt + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,stopAt);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              local_5c = atoi(pcVar8);
              bVar1 = true;
            }
          }
        }
      }
    }
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) {
      std::__cxx11::string::operator=((string *)&i,alphabet.field_2._M_local_buf + 8);
    }
    uVar10 = std::__cxx11::string::size();
    pcVar3 = local_20;
    auVar11._8_4_ = (int)((ulong)uVar10 >> 0x20);
    auVar11._0_8_ = uVar10;
    auVar11._12_4_ = 0x45300000;
    local_e0 = (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
    if (1.0 <= local_e0) {
      if (local_60 < 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"sub-command RANDOM invoked with bad length.",
                   (allocator<char> *)((long)&variableName + 7));
        cmExecutionStatus::SetError(pcVar3,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)((long)&variableName + 7));
        args_local._7_1_ = 0;
        local_108 = 1;
      }
      else {
        result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&alphaPtr);
        if (((HandleRandomCommand::seeded & 1U) == 0) || (bVar1)) {
          HandleRandomCommand::seeded = true;
          if (bVar1) {
            local_1ac = local_5c;
          }
          else {
            local_1ac = cmSystemTools::RandomSeed();
          }
          srand(local_1ac);
        }
        _idx = std::__cxx11::string::c_str();
        for (local_15c = 0; dVar2 = local_e0, local_15c < local_60; local_15c = local_15c + 1) {
          iVar5 = rand();
          local_160 = (int)(dVar2 * (double)iVar5 * 4.656612873077393e-10);
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)&alphaPtr,
                     (value_type *)(_idx + local_160));
        }
        local_161 = '\0';
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)&alphaPtr,&local_161);
        this = cmExecutionStatus::GetMakefile(local_20);
        uVar10 = result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)&alphaPtr);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,pcVar8);
        cmMakefile::AddDefinition(this,(string *)uVar10,local_178);
        args_local._7_1_ = 1;
        local_108 = 1;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)&alphaPtr);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"sub-command RANDOM invoked with bad alphabet.",&local_101);
      cmExecutionStatus::SetError(pcVar3,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      args_local._7_1_ = 0;
      local_108 = 1;
    }
    std::__cxx11::string::~string((string *)&i);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleRandomCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    status.SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    status.SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    status.SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args.back();

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  for (int cc = 0; cc < length; cc++) {
    int idx = static_cast<int>(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  status.GetMakefile().AddDefinition(variableName, result.data());
  return true;
}